

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int over;
  secp256k1_scalar *r;
  secp256k1_gej pt;
  secp256k1_fe aux [4];
  secp256k1_ge pre_a [4];
  secp256k1_strauss_point_state ps [1];
  uint local_73c;
  secp256k1_strauss_state local_738;
  secp256k1_gej local_720;
  secp256k1_fe local_688 [4];
  secp256k1_ge local_5c8 [4];
  secp256k1_strauss_point_state local_428;
  
  lVar3 = 0;
  bVar1 = false;
  r = (secp256k1_scalar *)0x0;
  do {
    uVar4 = (uint)tweak32[lVar3] | (int)r << 8;
    local_73c = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
    if (uVar4 < 0xd) {
      local_73c = uVar4;
    }
    r = (secp256k1_scalar *)(ulong)local_73c;
    if (uVar4 >= 0xd) {
      bVar1 = true;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  secp256k1_scalar_verify(r);
  iVar2 = 0;
  if (!bVar1) {
    secp256k1_gej_set_ge(&local_720,p);
    local_738.aux = local_688;
    local_738.pre_a = local_5c8;
    local_738.ps = &local_428;
    secp256k1_ecmult_strauss_wnaf
              (&local_738,&local_720,1,&local_720,&secp256k1_scalar_one,&local_73c);
    secp256k1_gej_verify(&local_720);
    iVar2 = 0;
    if (local_720.infinity == 0) {
      secp256k1_ge_set_gej(p,&local_720);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}